

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::EncodeTiledLevel
              (EXRImage *level_image,EXRHeader *exr_header,
              vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *data_list,size_t start_index,int num_x_tiles,int num_y_tiles,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
              int pixel_data_size,void *compression_param,string *err)

{
  bool bVar1;
  bool bVar2;
  size_type __n;
  reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  int *piVar6;
  reference pvVar7;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_RCX;
  size_type in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000010;
  string *in_stack_00000028;
  int data_len;
  bool ret;
  size_t data_header_size;
  uchar **images;
  EXRTile *tile;
  int y_tile;
  int x_tile;
  size_t data_idx;
  size_t tile_idx;
  int i;
  bool invalid_data;
  int num_tiles;
  int in_stack_000002b0;
  int in_stack_000002b4;
  int in_stack_000002b8;
  int in_stack_000002bc;
  uchar **in_stack_000002c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000002c8;
  int in_stack_000002e0;
  int in_stack_000002e8;
  int in_stack_000002f0;
  size_t in_stack_000002f8;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_stack_00000300;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000308;
  string *in_stack_00000310;
  void *in_stack_00000318;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  int local_60;
  int local_24;
  
  if ((((*(int *)(in_RDI + 0x20) < *(int *)(in_RSI + 0x3c)) ||
       (*(int *)(in_RDI + 0x24) < *(int *)(in_RSI + 0x40))) && (*(int *)(in_RDI + 0x10) == 0)) &&
     (*(int *)(in_RDI + 0x14) == 0)) {
    if (in_stack_00000028 != (string *)0x0) {
      std::__cxx11::string::operator+=(in_stack_00000028,"Failed to encode tile data.\n");
    }
    local_24 = -4;
  }
  else {
    bVar1 = false;
    for (local_60 = 0; local_60 < in_R9D * in_stack_00000008; local_60 = local_60 + 1) {
      __n = local_60 + in_R8;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](in_RCX,__n);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      pvVar3 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[](in_RCX,__n);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar3);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](in_RCX,__n);
      in_stack_ffffffffffffff48 = in_RDX;
      in_stack_ffffffffffffff50 = in_stack_00000010;
      bVar2 = EncodePixelData(in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,
                              in_stack_000002b8,in_stack_000002b4,in_stack_000002b0,
                              in_stack_000002e0,in_stack_000002e8,in_stack_000002f0,
                              in_stack_000002f8,in_stack_00000300,in_stack_00000308,
                              in_stack_00000310,in_stack_00000318);
      if (bVar2) {
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar3);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,0);
        *piVar6 = local_60 % in_R9D;
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,4);
        *piVar6 = local_60 / in_R9D;
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar3,8);
        *(undefined4 *)pvVar7 = *(undefined4 *)(in_RDI + 0x10);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvVar3,0xc);
        *(undefined4 *)pvVar7 = *(undefined4 *)(in_RDI + 0x14);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,0x10);
        *piVar6 = (int)sVar5 - (int)sVar4;
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,0);
        swap4(piVar6);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,4);
        swap4(piVar6);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,8);
        swap4(piVar6);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,0xc);
        swap4(piVar6);
        pvVar3 = std::
                 vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator[](in_RCX,__n);
        piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  (pvVar3,0x10);
        swap4(piVar6);
      }
      else {
        bVar1 = true;
      }
    }
    if (bVar1) {
      if (in_stack_00000028 != (string *)0x0) {
        std::__cxx11::string::operator+=(in_stack_00000028,"Failed to encode tile data.\n");
      }
      local_24 = -4;
    }
    else {
      local_24 = 0;
    }
  }
  return local_24;
}

Assistant:

static int EncodeTiledLevel(const EXRImage* level_image, const EXRHeader* exr_header,
                            const std::vector<tinyexr::ChannelInfo>& channels,
                            std::vector<std::vector<unsigned char> >& data_list,
                            size_t start_index, // for data_list
                            int num_x_tiles, int num_y_tiles,
                            const std::vector<size_t>& channel_offset_list,
                            int pixel_data_size,
                            const void* compression_param, // must be set if zfp compression is enabled
                            std::string* err) {
  int num_tiles = num_x_tiles * num_y_tiles;
  assert(num_tiles == level_image->num_tiles);

  if ((exr_header->tile_size_x > level_image->width || exr_header->tile_size_y > level_image->height) &&
      level_image->level_x == 0 && level_image->level_y == 0) {
      if (err) {
        (*err) += "Failed to encode tile data.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }


#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<bool> invalid_data(false);
#else
  bool invalid_data(false);
#endif

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::vector<std::thread> workers;
  std::atomic<int> tile_count(0);

  int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
  if (num_threads > int(num_tiles)) {
    num_threads = int(num_tiles);
  }

  for (int t = 0; t < num_threads; t++) {
    workers.emplace_back(std::thread([&]() {
      int i = 0;
      while ((i = tile_count++) < num_tiles) {

#else
  // Use signed int since some OpenMP compiler doesn't allow unsigned type for
  // `parallel for`
#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < num_tiles; i++) {

#endif
    size_t tile_idx = static_cast<size_t>(i);
    size_t data_idx = tile_idx + start_index;

    int x_tile = i % num_x_tiles;
    int y_tile = i / num_x_tiles;

    EXRTile& tile = level_image->tiles[tile_idx];
 
    const unsigned char* const* images =
      static_cast<const unsigned char* const*>(tile.images);

    data_list[data_idx].resize(5*sizeof(int));
    size_t data_header_size = data_list[data_idx].size();
    bool ret = EncodePixelData(data_list[data_idx],                         
                               images,
                               exr_header->compression_type,
                               0, // increasing y
                               tile.width,
                               exr_header->tile_size_y,
                               exr_header->tile_size_x,
                               0,
                               tile.height,
                               pixel_data_size,
                               channels,
                               channel_offset_list,
                               err, compression_param);
    if (!ret) {
      invalid_data = true;
      continue;
    }
    assert(data_list[data_idx].size() > data_header_size);
    int data_len = static_cast<int>(data_list[data_idx].size() - data_header_size);
    //tileX, tileY, levelX, levelY // pixel_data_size(int)
    memcpy(&data_list[data_idx][0], &x_tile, sizeof(int));
    memcpy(&data_list[data_idx][4], &y_tile, sizeof(int));
    memcpy(&data_list[data_idx][8], &level_image->level_x, sizeof(int));
    memcpy(&data_list[data_idx][12], &level_image->level_y, sizeof(int));
    memcpy(&data_list[data_idx][16], &data_len, sizeof(int));

    swap4(reinterpret_cast<int*>(&data_list[data_idx][0]));
    swap4(reinterpret_cast<int*>(&data_list[data_idx][4]));
    swap4(reinterpret_cast<int*>(&data_list[data_idx][8]));
    swap4(reinterpret_cast<int*>(&data_list[data_idx][12]));
    swap4(reinterpret_cast<int*>(&data_list[data_idx][16]));

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  }
}));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif

  if (invalid_data) {
    if (err) {
      (*err) += "Failed to encode tile data.\n";  
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }
  return TINYEXR_SUCCESS;
}